

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O2

bool runArmips(ArmipsArguments *arguments)

{
  int iVar1;
  CMacro *this;
  bool bVar2;
  reference pvVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  size_t i_1;
  long lVar6;
  size_t i;
  ulong uVar7;
  wstring equline;
  
  Global.Revalidate = true;
  Global.Section = 0;
  Global.Radix = 10;
  Global.nocash = false;
  Global.relativeInclude = false;
  Global.IncludeNestingLevel = 0;
  Global.MacroNestingLevel = 0;
  Global.FileInfo._24_8_ = Global.FileInfo._24_8_ & 0xffffffff00000000;
  Global.FileInfo.TotalLineCount = 0;
  Global.DebugMessages = 0;
  Global.validationPasses = 0;
  Arch = &InvalidArchitecture.super_CArchitecture;
  Logger::clear();
  SymbolData::clear(&Global.symData);
  EncodingTable::clear(&Global.Table);
  SymbolTable::clear(&Global.symbolTable);
  TempData::clear(&Global.tempData);
  if (Global.conditionData.conditions.
      super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.conditionData.conditions.
      super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Global.conditionData.conditions.
    super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Global.conditionData.conditions.
         super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.areaData.entries.super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      Global.areaData.entries.super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    Global.areaData.entries.super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         Global.areaData.entries.
         super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         Global.Commands.
         super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&Global.FileInfo);
  Global.FileInfo.FileCount = 0;
  Global.FileInfo.FileNum = 0;
  Global.FileInfo.LineNumber = 0;
  Global.FileInfo.TotalLineCount = 0;
  CArmArchitecture::clear(&Arm);
  Logger::silent = arguments->silent;
  Logger::errorOnWarning = arguments->errorOnWarning;
  if ((arguments->symFileName)._M_string_length != 0) {
    iVar1 = arguments->symFileVersion;
    std::__cxx11::wstring::_M_assign((wstring *)&Global.symData);
    Global.symData.nocashSymVersion = iVar1;
  }
  if ((arguments->tempFileName)._M_string_length != 0) {
    std::__cxx11::wstring::_M_assign((wstring *)&Global.tempData.file.fileName);
  }
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(arguments->equList).
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(arguments->equList).
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::at(&arguments->equList,uVar7);
    std::__cxx11::wstring::wstring((wstring *)&equline,(wstring *)pvVar3);
    CheckEquLabel(&equline);
    std::__cxx11::wstring::~wstring((wstring *)&equline);
  }
  SymbolTable::addLabels(&Global.symbolTable,&arguments->labels);
  if (arguments->mode == File) {
    Global.memoryMode = false;
    LoadAssemblyFile(&arguments->inputFileName,GUESS);
  }
  else if (arguments->mode == Memory) {
    Global.memoryMode = true;
    Global.memoryFile = arguments->memoryFile;
    LoadAssemblyContent(&arguments->content);
  }
  if (Logger::error == false) {
    bVar2 = EncodeAssembly();
  }
  else {
    bVar2 = false;
  }
  if (arguments->errorsResult != (StringList *)0x0) {
    Logger::getErrors_abi_cxx11_();
    lVar6 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(equline._M_string_length - (long)equline._M_dataplus._M_p) >> 5);
        uVar7 = uVar7 + 1) {
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back(arguments->errorsResult,(value_type *)((long)equline._M_dataplus._M_p + lVar6));
      lVar6 = lVar6 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&equline);
  }
  ppCVar4 = Global.Commands.
            super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar5 = Global.Commands.
            super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (uVar7 = 0; uVar7 < (ulong)((long)ppCVar5 - (long)ppCVar4 >> 3); uVar7 = uVar7 + 1) {
    if (ppCVar4[uVar7] != (CAssemblerCommand *)0x0) {
      (*ppCVar4[uVar7]->_vptr_CAssemblerCommand[1])();
      ppCVar4 = Global.Commands.
                super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppCVar5 = Global.Commands.
                super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  uVar7 = 0;
  while( true ) {
    if ((ulong)((long)Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar7) break;
    this = Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7];
    if (this != (CMacro *)0x0) {
      CMacro::~CMacro(this);
    }
    operator_delete(this);
    uVar7 = uVar7 + 1;
  }
  if (Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         Global.Commands.
         super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  return bVar2;
}

Assistant:

bool runArmips(ArmipsArguments& arguments)
{
	// initialize and reset global data
	Global.Radix = 10;
	Global.Revalidate = true;
	Global.Section = 0;
	Global.nocash = false;
	Global.IncludeNestingLevel = 0;
	Global.MacroNestingLevel = 0;
	Global.FileInfo.FileCount = 0;
	Global.FileInfo.TotalLineCount = 0;
	Global.DebugMessages = 0;
	Global.relativeInclude = false;
	Global.validationPasses = 0;
	Arch = &InvalidArchitecture;

	Logger::clear();
	Global.symData.clear();
	Global.Table.clear();
	Global.symbolTable.clear();
	Global.tempData.clear();
	Global.conditionData.clear();
	Global.areaData.clear();
	Global.Commands.clear();
	Global.Macros.clear();

	Global.FileInfo.FileList.Clear();
	Global.FileInfo.FileCount = 0;
	Global.FileInfo.TotalLineCount = 0;
	Global.FileInfo.LineNumber = 0;
	Global.FileInfo.FileNum = 0;

	Arm.clear();

	// process arguments
	Logger::setSilent(arguments.silent);
	Logger::setErrorOnWarning(arguments.errorOnWarning);

	if (!arguments.symFileName.empty())
		Global.symData.setNocashSymFileName(arguments.symFileName,arguments.symFileVersion);

	if (!arguments.tempFileName.empty())
		Global.tempData.setFileName(arguments.tempFileName);

	for (size_t i = 0; i < arguments.equList.size(); i++)
	{
		std::wstring equline = arguments.equList.at(i);
		CheckEquLabel(equline);
	}

	Global.symbolTable.addLabels(arguments.labels);

	// run assembler
	switch (arguments.mode)
	{
	case ArmipsMode::File:
		Global.memoryMode = false;
		LoadAssemblyFile(arguments.inputFileName);
		break;
	case ArmipsMode::Memory:
		Global.memoryMode = true;
		Global.memoryFile = arguments.memoryFile;
		LoadAssemblyContent(arguments.content);
		break;
	}

	bool result = !Logger::hasError();
	if (result == true)
		result = EncodeAssembly();

	// return errors
	if (arguments.errorsResult != NULL)
	{
		StringList errors = Logger::getErrors();
		for (size_t i = 0; i < errors.size(); i++)
			arguments.errorsResult->push_back(errors[i]);
	}

	// cleanup
	for (size_t i = 0; i < Global.Commands.size(); i++)
		delete Global.Commands[i];	

	for (size_t i = 0; i < Global.Macros.size(); i++)
		delete Global.Macros[i];

	Global.Commands.clear();
	Global.Macros.clear();

	return result;
}